

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

DistributionMapping amrex::DistributionMapping::makeRoundRobin(MultiFab *weight)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  DistributionMapping DVar1;
  undefined1 unaff_retaddr;
  int unaff_retaddr_00;
  vector<long,_std::allocator<long>_> *in_stack_00000008;
  DistributionMapping *in_stack_00000010;
  int nprocs;
  Vector<long,_std::allocator<long>_> cost;
  DistributionMapping *r;
  MultiFab *in_stack_ffffffffffffffe8;
  
  anon_unknown_22::gather_weights(in_stack_ffffffffffffffe8);
  ParallelContext::NProcsSub();
  DistributionMapping((DistributionMapping *)0xf5b6b2);
  RoundRobinProcessorMap(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
  Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0xf5b71a);
  DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (DistributionMapping)
         DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeRoundRobin (const MultiFab& weight)
{
    BL_PROFILE("makeRoundRobin");
    Vector<Long> cost = gather_weights(weight);
    int nprocs = ParallelContext::NProcsSub();
    DistributionMapping r;
    r.RoundRobinProcessorMap(cost, nprocs);
    return r;
}